

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O2

void __thiscall verona::Assume::Assume(Assume *this,Btype *sub_,Btype *sup_)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  Token local_38;
  undefined1 *local_30;
  initializer_list<trieste::Token> local_28;
  
  std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *)sub_);
  std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *)&this->sup,
             (__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *)sup_);
  local_38.def = (TokenDef *)Class;
  local_30 = Trait;
  local_28._M_len = 2;
  local_28._M_array = &local_38;
  bVar1 = BtypeDef::in((this->sub).super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&local_28);
  if (bVar1) {
    if ((((((this->sup).super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_).def
        == (TokenDef *)Trait) {
      return;
    }
    __assertion = "sup == Trait";
    __line = 0x26;
  }
  else {
    __assertion = "sub->in({Class, Trait})";
    __line = 0x25;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/subtype.cc"
                ,__line,"verona::Assume::Assume(Btype, Btype)");
}

Assistant:

Assume(Btype sub_, Btype sup_) : sub(sub_), sup(sup_)
    {
      assert(sub->in({Class, Trait}));
      assert(sup == Trait);
    }